

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

void __thiscall musicBlock::OPLplayMusic(musicBlock *this,int vol)

{
  undefined4 local_18;
  uint i;
  int vol_local;
  musicBlock *this_local;
  
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    OPLresetControllers(this,local_18,vol);
  }
  return;
}

Assistant:

void musicBlock::OPLplayMusic(int vol)
{
	uint i;

	for (i = 0; i < CHANNELS; i++)
	{
		OPLresetControllers(i, vol);
	}
}